

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O0

void __thiscall
OpenMD::EAM::addExplicitInteraction
          (EAM *this,AtomType *atype1,AtomType *atype2,RealType re,RealType alpha,RealType beta,
          RealType A,RealType B,RealType kappa,RealType lambda)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  _Rb_tree_const_iterator<int> __x;
  reference pvVar4;
  reference pvVar5;
  AtomType *in_RDX;
  AtomType *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar6;
  pair<std::_Rb_tree_const_iterator<int>,_bool> ret;
  int eamtid2;
  int eamtid1;
  int atid2;
  int atid1;
  int i;
  RealType dr;
  RealType rcut;
  RealType r;
  int Nr;
  vector<double,_std::allocator<double>_> jVals;
  vector<double,_std::allocator<double>_> phiVals;
  vector<double,_std::allocator<double>_> rVals;
  EAMInteractionData mixer;
  CubicSplinePtr cs;
  EAMInteractionData *in_stack_fffffffffffffde8;
  value_type in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  undefined4 uVar7;
  value_type_conflict2 *in_stack_fffffffffffffdf8;
  value_type in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 uVar8;
  value_type_conflict1 *in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe18;
  CubicSpline *in_stack_fffffffffffffe20;
  RealType in_stack_fffffffffffffe28;
  EAM *in_stack_fffffffffffffe30;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_1a0;
  _Base_ptr local_190;
  undefined1 local_188;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_180;
  pair<std::_Rb_tree_const_iterator<int>,_bool> local_170;
  value_type local_160;
  value_type local_15c;
  int local_158;
  int local_154;
  pair<double,_double> local_150;
  EAM *local_140;
  int local_134;
  double local_130;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  int local_ec;
  double local_70;
  undefined1 local_68;
  double local_20;
  AtomType *local_18;
  AtomType *local_10;
  
  local_20 = in_XMM0_Qa;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::make_shared<OpenMD::CubicSpline>();
  EAMInteractionData::EAMInteractionData
            ((EAMInteractionData *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3ea102);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3ea10f);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x3ea11c);
  local_ec = 2000;
  local_108 = 12.0;
  local_110 = 9.0;
  local_118 = local_20 * 4.0;
  pdVar3 = std::max<double>(&local_110,&local_118);
  pdVar3 = std::min<double>(&local_108,pdVar3);
  local_100 = *pdVar3;
  local_130 = local_100 / (double)(local_ec + -1);
  for (local_134 = 0; local_134 < local_ec; local_134 = local_134 + 1) {
    local_f8 = (double)local_134 * local_130;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdf8);
    in_stack_fffffffffffffe30 =
         (EAM *)Phi(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                    (RealType)in_stack_fffffffffffffe20,(RealType)in_stack_fffffffffffffe18,
                    (RealType)CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10),
                    (RealType)in_stack_fffffffffffffe08,
                    (RealType)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                    (RealType)in_stack_fffffffffffffdf8,
                    (RealType)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    local_140 = in_stack_fffffffffffffe30;
    std::vector<double,_std::allocator<double>_>::push_back
              ((vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               (value_type_conflict2 *)in_stack_fffffffffffffde8);
  }
  std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3ea328);
  CubicSpline::addPoints
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe14,in_stack_fffffffffffffe10));
  std::shared_ptr<OpenMD::CubicSpline>::operator=
            ((shared_ptr<OpenMD::CubicSpline> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             &in_stack_fffffffffffffde8->phi);
  std::__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<OpenMD::CubicSpline,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x3ea366);
  local_150 = CubicSpline::getLimits
                        ((CubicSpline *)
                         CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
  local_70 = local_150.second;
  local_68 = 1;
  iVar1 = AtomType::getIdent(local_10);
  local_154 = iVar1;
  iVar2 = AtomType::getIdent(local_18);
  local_158 = iVar2;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::
  pair<std::_Rb_tree_const_iterator<int>,_bool,_true>
            ((pair<std::_Rb_tree_const_iterator<int>,_bool> *)
             CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)CONCAT44(iVar1,iVar2),
                     in_stack_fffffffffffffe08);
  __x = pVar6.first._M_node;
  local_188 = pVar6.second;
  uVar8 = CONCAT13(local_188,(int3)in_stack_fffffffffffffe04);
  local_190 = __x._M_node;
  local_180.first._M_node = __x._M_node;
  local_180.second = (bool)local_188;
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_170,&local_180);
  if ((local_170.second & 1U) == 0) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_154);
    local_15c = *pvVar4;
  }
  else {
    local_15c = *(value_type *)(in_RDI + 0x88);
    in_stack_fffffffffffffe00 = *(value_type *)(in_RDI + 0x88);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_154);
    *pvVar4 = in_stack_fffffffffffffe00;
    *(int *)(in_RDI + 0x88) = *(int *)(in_RDI + 0x88) + 1;
  }
  pVar6 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                    ((set<int,_std::less<int>,_std::allocator<int>_> *)CONCAT44(iVar1,iVar2),
                     (value_type_conflict1 *)__x._M_node);
  local_1a0.first = pVar6.first._M_node;
  local_1a0.second = pVar6.second;
  uVar7 = CONCAT13(local_1a0.second,(int3)in_stack_fffffffffffffdf4);
  std::pair<std::_Rb_tree_const_iterator<int>,_bool>::operator=(&local_170,&local_1a0);
  if ((local_170.second & 1U) == 0) {
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_158);
    local_160 = *pvVar4;
  }
  else {
    local_160 = *(value_type *)(in_RDI + 0x88);
    in_stack_fffffffffffffdf0 = *(value_type *)(in_RDI + 0x88);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x40),(long)local_158);
    *pvVar4 = in_stack_fffffffffffffdf0;
    *(int *)(in_RDI + 0x88) = *(int *)(in_RDI + 0x88) + 1;
  }
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::resize((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
            *)CONCAT44(iVar1,iVar2),(size_type)__x._M_node);
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::operator[]((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                *)(in_RDI + 0x70),(long)local_15c);
  std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
            ((vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_> *)
             CONCAT44(iVar1,iVar2),(size_type)__x._M_node);
  pvVar5 = std::
           vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
           ::operator[]((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                         *)(in_RDI + 0x70),(long)local_15c);
  std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::operator[]
            (pvVar5,(long)local_160);
  EAMInteractionData::operator=
            ((EAMInteractionData *)CONCAT44(uVar7,in_stack_fffffffffffffdf0),
             in_stack_fffffffffffffde8);
  if (local_160 != local_15c) {
    std::
    vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
    ::operator[]((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                  *)(in_RDI + 0x70),(long)local_160);
    std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
              ((vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_> *)
               CONCAT44(iVar1,iVar2),(size_type)__x._M_node);
    pvVar5 = std::
             vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
             ::operator[]((vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                           *)(in_RDI + 0x70),(long)local_160);
    std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::operator[]
              (pvVar5,(long)local_15c);
    EAMInteractionData::operator=
              ((EAMInteractionData *)CONCAT44(uVar7,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar8,in_stack_fffffffffffffe00));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar8,in_stack_fffffffffffffe00));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar8,in_stack_fffffffffffffe00));
  EAMInteractionData::~EAMInteractionData
            ((EAMInteractionData *)CONCAT44(uVar7,in_stack_fffffffffffffdf0));
  std::shared_ptr<OpenMD::CubicSpline>::~shared_ptr((shared_ptr<OpenMD::CubicSpline> *)0x3ea6ec);
  return;
}

Assistant:

void EAM::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                   RealType re, RealType alpha, RealType beta,
                                   RealType A, RealType B, RealType kappa,
                                   RealType lambda) {
    CubicSplinePtr cs {std::make_shared<CubicSpline>()};

    EAMInteractionData mixer;
    std::vector<RealType> rVals;
    std::vector<RealType> phiVals;
    std::vector<RealType> jVals;

    int Nr = 2000;
    RealType r;

    // default to FCC if we don't specify HCP or BCC:
    // RealType rcut = sqrt(5.0) * re;
    RealType rcut = std::min(12.0, std::max(9.0, 4.0 * re));
    RealType dr   = rcut / (RealType)(Nr - 1);

    for (int i = 0; i < Nr; i++) {
      r = RealType(i) * dr;
      rVals.push_back(r);
      phiVals.push_back(Phi(r, re, A, B, alpha, beta, kappa, lambda));
    }
    cs->addPoints(rVals, phiVals);
    mixer.phi           = cs;
    mixer.rcut          = mixer.phi->getLimits().second;
    mixer.explicitlySet = true;

    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();

    int eamtid1, eamtid2;

    pair<set<int>::iterator, bool> ret;
    ret = EAMtypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid1 = EAMtids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid1        = nEAM_;
      EAMtids[atid1] = nEAM_;
      nEAM_++;
    }

    ret = EAMtypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid2 = EAMtids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid2        = nEAM_;
      EAMtids[atid2] = nEAM_;
      nEAM_++;
    }

    MixingMap.resize(nEAM_);
    MixingMap[eamtid1].resize(nEAM_);
    MixingMap[eamtid1][eamtid2] = mixer;
    if (eamtid2 != eamtid1) {
      MixingMap[eamtid2].resize(nEAM_);
      MixingMap[eamtid2][eamtid1] = mixer;
    }
    return;
  }